

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O1

mcpl_generic_filehandle_t *
mcpl_generic_fopen(mcpl_generic_filehandle_t *__return_storage_ptr__,char *filename)

{
  mcpl_generic_fopen_try(__return_storage_ptr__,filename);
  if (__return_storage_ptr__->internal != (void *)0x0) {
    return __return_storage_ptr__;
  }
  (*mcpl_error_handler)("Unable to open file!");
  printf("MCPL ERROR: %s\n",
         "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!");
  exit(1);
}

Assistant:

mcpl_generic_filehandle_t mcpl_generic_fopen( const char * filename )
{
  mcpl_generic_filehandle_t res = mcpl_generic_fopen_try(filename);
  if (!res.internal)
    mcpl_error("Unable to open file!");
  return res;
}